

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AS_02_TimedText.cpp
# Opt level: O0

h__Reader * __thiscall
AS_02::TimedText::MXFReader::h__Reader::ReadAncillaryResource
          (h__Reader *this,UUID *uuid,FrameBuffer *frame_buf,AESDecContext *Ctx,HMACContext *HMAC)

{
  bool bVar1;
  int iVar2;
  ILogSink *this_00;
  char *pcVar3;
  byte_t *buf_00;
  long local_160;
  undefined1 local_128 [128];
  TimedTextResourceSubDescriptor *desc_object;
  long local_a0;
  InterchangeObject *tmp_iobj;
  char buf [64];
  _Rb_tree_const_iterator<std::pair<const_Kumu::UUID,_Kumu::UUID>_> local_50;
  iterator local_48;
  _Rb_tree_const_iterator<std::pair<const_Kumu::UUID,_Kumu::UUID>_> local_40;
  const_iterator ri;
  HMACContext *HMAC_local;
  AESDecContext *Ctx_local;
  FrameBuffer *frame_buf_local;
  UUID *uuid_local;
  h__Reader *this_local;
  Result_t *result;
  
  local_48._M_node =
       (_Base_ptr)
       std::
       map<Kumu::UUID,_Kumu::UUID,_std::less<Kumu::UUID>,_std::allocator<std::pair<const_Kumu::UUID,_Kumu::UUID>_>_>
       ::find((map<Kumu::UUID,_Kumu::UUID,_std::less<Kumu::UUID>,_std::allocator<std::pair<const_Kumu::UUID,_Kumu::UUID>_>_>
               *)&uuid[0x28].super_Identifier<16U>.m_HasValue,(key_type *)frame_buf);
  std::_Rb_tree_const_iterator<std::pair<const_Kumu::UUID,_Kumu::UUID>_>::_Rb_tree_const_iterator
            (&local_40,&local_48);
  buf._56_8_ = std::
               map<Kumu::UUID,_Kumu::UUID,_std::less<Kumu::UUID>,_std::allocator<std::pair<const_Kumu::UUID,_Kumu::UUID>_>_>
               ::end((map<Kumu::UUID,_Kumu::UUID,_std::less<Kumu::UUID>,_std::allocator<std::pair<const_Kumu::UUID,_Kumu::UUID>_>_>
                      *)&uuid[0x28].super_Identifier<16U>.m_HasValue);
  std::_Rb_tree_const_iterator<std::pair<const_Kumu::UUID,_Kumu::UUID>_>::_Rb_tree_const_iterator
            (&local_50,(iterator *)(buf + 0x38));
  bVar1 = std::operator==(&local_40,&local_50);
  if (bVar1) {
    this_00 = (ILogSink *)Kumu::DefaultLogSink();
    pcVar3 = Kumu::UUID::EncodeHex((UUID *)frame_buf,(char *)&tmp_iobj,0x40);
    Kumu::ILogSink::Error(this_00,"No such resource: %s\n",pcVar3);
    Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)ASDCP::RESULT_RANGE);
  }
  else {
    local_a0 = 0;
    desc_object._7_1_ = 0;
    std::_Rb_tree_const_iterator<std::pair<const_Kumu::UUID,_Kumu::UUID>_>::operator*(&local_40);
    ASDCP::MXF::OP1aHeader::GetMDObjectByID
              ((UUID *)this,(InterchangeObject **)((uuid->super_Identifier<16U>).m_Value + 0xf));
    if (local_a0 == 0) {
      local_160 = 0;
    }
    else {
      local_160 = __dynamic_cast(local_a0,&ASDCP::MXF::InterchangeObject::typeinfo,
                                 &ASDCP::MXF::TimedTextResourceSubDescriptor::typeinfo);
    }
    local_128._120_8_ = local_160;
    iVar2 = Kumu::Result_t::operator_cast_to_int((Result_t *)this);
    if (-1 < iVar2) {
      if (local_128._120_8_ == 0) {
        __assert_fail("desc_object",
                      "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/AS_02_TimedText.cpp"
                      ,0xd3,
                      "ASDCP::Result_t AS_02::TimedText::MXFReader::h__Reader::ReadAncillaryResource(const Kumu::UUID &, ASDCP::TimedText::FrameBuffer &, AESDecContext *, HMACContext *)"
                     );
      }
      ASDCP::MXF::TrackFileReader<ASDCP::MXF::OP1aHeader,_AS_02::MXF::AS02IndexReader>::
      ReadGenericStreamPartitionPayload
                ((TrackFileReader<ASDCP::MXF::OP1aHeader,_AS_02::MXF::AS02IndexReader> *)local_128,
                 (ui32_t)uuid,(FrameBuffer *)(ulong)*(uint *)(local_128._120_8_ + 0xe8),Ctx,HMAC);
      Kumu::Result_t::operator=((Result_t *)this,(Result_t *)local_128);
      Kumu::Result_t::~Result_t((Result_t *)local_128);
    }
    iVar2 = Kumu::Result_t::operator_cast_to_int((Result_t *)this);
    if (-1 < iVar2) {
      buf_00 = Kumu::Identifier<16U>::Value((Identifier<16U> *)frame_buf);
      ASDCP::TimedText::FrameBuffer::AssetID((FrameBuffer *)Ctx,buf_00);
      ASDCP::TimedText::FrameBuffer::MIMEType
                ((FrameBuffer *)Ctx,(string *)(local_128._120_8_ + 200));
    }
  }
  return this;
}

Assistant:

ASDCP::Result_t
AS_02::TimedText::MXFReader::h__Reader::ReadAncillaryResource(const Kumu::UUID& uuid,
							      ASDCP::TimedText::FrameBuffer& frame_buf,
							      AESDecContext* Ctx, HMACContext* HMAC)
{
  ResourceMap_t::const_iterator ri = m_ResourceMap.find(uuid);
  if ( ri == m_ResourceMap.end() )
    {
      char buf[64];
      DefaultLogSink().Error("No such resource: %s\n", uuid.EncodeHex(buf, 64));
      return RESULT_RANGE;
    }

  // get the subdescriptor
  InterchangeObject* tmp_iobj = 0;
  Result_t result = m_HeaderPart.GetMDObjectByID((*ri).second, &tmp_iobj);
  TimedTextResourceSubDescriptor* desc_object = dynamic_cast<TimedTextResourceSubDescriptor*>(tmp_iobj);

  if ( KM_SUCCESS(result) )
    {
      assert(desc_object);
      result = ReadGenericStreamPartitionPayload(desc_object->EssenceStreamID, frame_buf, Ctx, HMAC);
    }

  if ( KM_SUCCESS(result) )
    {
      frame_buf.AssetID(uuid.Value());
      frame_buf.MIMEType(desc_object->MIMEMediaType);
    }
  
  return result;
}